

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O1

bool __thiscall GOESRProduct::isComplete(GOESRProduct *this)

{
  long lVar1;
  bool bVar2;
  SegmentIdentificationHeader sih;
  SegmentIdentificationHeader local_22;
  
  bVar2 = true;
  if (this->segmented_ == true) {
    lVar1 = (long)(((this->files_).
                    super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    lrit::getHeader<lrit::SegmentIdentificationHeader>
              (&local_22,(Buffer *)(lVar1 + 0x38),(HeaderMap *)(lVar1 + 0x50));
    bVar2 = (long)(this->files_).
                  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->files_).
                  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4 == (ulong)local_22.maxSegment;
  }
  return bVar2;
}

Assistant:

bool GOESRProduct::isComplete() const {
  if (!isSegmented()) {
    return true;
  }

  auto sih = getHeader<lrit::SegmentIdentificationHeader>();
  return files_.size() == sih.maxSegment;
}